

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O3

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::tanh_sinh_detail(tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                   *this,size_t max_refinements,
                  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *min_complement)

{
  base_type *pbVar1;
  cpp_dec_float<100U,_int,_void> *pcVar2;
  
  (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_weights).
  super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_weights).
  super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_abscissas).
  super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_weights).
  super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_abscissas).
  super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_abscissas).
  super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_max_refinements = max_refinements;
  (this->m_t_max).base.m_backend.fpclass = cpp_dec_float_finite;
  (this->m_t_max).base.m_backend.prec_elem = 0x10;
  (this->m_mutex).m_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).m_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).m_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).m_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).m_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pbVar1 = &(this->m_t_max).base;
  (pbVar1->m_backend).data._M_elems[0] = 0;
  (pbVar1->m_backend).data._M_elems[1] = 0;
  pcVar2 = &(this->m_t_max).base.m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->m_t_max).base.m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->m_t_max).base.m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->m_t_max).base.m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->m_t_max).base.m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->m_t_max).base.m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  *(undefined8 *)((long)(this->m_t_max).base.m_backend.data._M_elems + 0x35) = 0;
  *(undefined8 *)((long)(this->m_t_max).base.m_backend.data._M_elems + 0x3d) = 0;
  (this->m_t_crossover).base.m_backend.fpclass = cpp_dec_float_finite;
  pbVar1 = &(this->m_t_crossover).base;
  (pbVar1->m_backend).data._M_elems[0] = 0;
  (pbVar1->m_backend).data._M_elems[1] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(this->m_t_crossover).base.m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  *(undefined8 *)((long)(this->m_t_crossover).base.m_backend.data._M_elems + 0x3d) = 0;
  (this->m_t_crossover).base.m_backend.prec_elem = 0x10;
  init(this,(EVP_PKEY_CTX *)min_complement);
  return;
}

Assistant:

tanh_sinh_detail(size_t max_refinements, const Real& min_complement) : m_max_refinements(max_refinements)
    {
       typedef std::integral_constant<int, initializer_selector> tag_type;
       init(min_complement, tag_type());
    }